

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O2

bool libtorrent::dht::verify_message_impl
               (bdecode_node *message,span<const_libtorrent::dht::key_desc_t> desc,
               span<libtorrent::bdecode_node> ret,span<char> error)

{
  bool bVar1;
  bool bVar2;
  type_t tVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  bdecode_node *pbVar8;
  char *pcVar9;
  char *__format;
  long lVar10;
  key_desc_t *pkVar11;
  long lVar12;
  bdecode_node *pbVar13;
  key_desc_t *pkVar14;
  int *piVar15;
  string_view key;
  bdecode_node msg;
  bdecode_node stack [5];
  int local_21c;
  bdecode_node local_1f8;
  bdecode_node local_1b8;
  bdecode_node local_178;
  bdecode_node abStack_138 [4];
  
  lVar12 = ret.m_len;
  pbVar8 = ret.m_ptr;
  pkVar11 = desc.m_ptr;
  bdecode_node::non_owning(&local_1f8,message);
  lVar6 = 0;
  pbVar13 = pbVar8;
  if (0 < lVar12) {
    lVar6 = lVar12;
  }
  while (lVar6 != 0) {
    bdecode_node::clear(pbVar13);
    lVar6 = lVar6 + -1;
    pbVar13 = pbVar13 + 1;
  }
  lVar6 = 0;
  do {
    *(undefined8 *)((long)abStack_138 + lVar6 + -0x24) = 0;
    *(undefined8 *)((long)abStack_138 + lVar6 + -0x1c) = 0;
    *(undefined8 *)((long)abStack_138 + lVar6 + -0x30) = 0;
    *(undefined8 *)((long)abStack_138 + lVar6 + -0x28) = 0;
    *(undefined8 *)
     ((long)&local_178.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar6) = 0;
    *(undefined8 *)((long)abStack_138 + lVar6 + -0x38) = 0;
    *(undefined4 *)((long)abStack_138 + lVar6 + -0x14) = 0xffffffff;
    *(undefined4 *)((long)abStack_138 + lVar6 + -0x10) = 0xffffffff;
    *(undefined4 *)((long)abStack_138 + lVar6 + -0xc) = 0xffffffff;
    *(undefined4 *)((long)abStack_138 + lVar6 + -8) = 0xffffffff;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x140);
  tVar3 = bdecode_node::type(&local_1f8);
  if (tVar3 == dict_t) {
    bdecode_node::operator=(&local_178,&local_1f8);
    local_21c = 0;
    iVar5 = 0;
    while( true ) {
      lVar6 = (long)iVar5;
      bVar2 = lVar12 <= lVar6;
      if (lVar12 <= lVar6) break;
      pcVar9 = pkVar11[lVar6].name;
      sVar7 = strlen(pcVar9);
      key._M_str = pcVar9;
      key._M_len = sVar7;
      bdecode_node::dict_find(&local_1b8,&local_1f8,key);
      pkVar14 = pkVar11 + lVar6;
      pbVar13 = pbVar8 + lVar6;
      bdecode_node::operator=(pbVar13,&local_1b8);
      ::std::
      _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       *)&local_1b8);
      bVar1 = bdecode_node::operator_cast_to_bool(pbVar13);
      if ((bVar1) &&
         (tVar3 = bdecode_node::type(pbVar13), pkVar14->type != none_t && tVar3 != pkVar14->type)) {
        bdecode_node::clear(pbVar13);
      }
      bVar1 = bdecode_node::operator_cast_to_bool(pbVar13);
      if ((!bVar1) && ((pkVar14->flags & 1) == 0)) {
        pcVar9 = pkVar14->name;
        __format = "missing \'%s\' key";
LAB_0035d379:
        bVar2 = false;
        snprintf(error.m_ptr,error.m_len,__format,pcVar9);
        break;
      }
      if (((0 < pkVar14->size) && (bVar1 = bdecode_node::operator_cast_to_bool(pbVar13), bVar1)) &&
         (pkVar14->type == 3)) {
        if ((pkVar14->flags & 8) == 0) {
          iVar4 = bdecode_node::string_length(pbVar13);
          if (iVar4 != pkVar14->size) {
LAB_0035d254:
            bdecode_node::clear(pbVar13);
            if ((pkVar14->flags & 1) == 0) {
              pcVar9 = pkVar14->name;
              __format = "invalid value for \'%s\'";
              goto LAB_0035d379;
            }
          }
        }
        else {
          iVar4 = bdecode_node::string_length(pbVar13);
          if (iVar4 % pkVar14->size != 0) goto LAB_0035d254;
        }
      }
      if ((pkVar14->flags & 2U) == 0) {
        if ((pkVar14->flags & 4U) != 0) {
          if (local_21c == 0) break;
          bdecode_node::operator=(&local_1f8,&local_1b8 + local_21c);
          local_21c = local_21c + -1;
        }
      }
      else {
        bVar2 = bdecode_node::operator_cast_to_bool(pbVar13);
        if (bVar2) {
          bdecode_node::operator=(&local_1f8,pbVar13);
          bdecode_node::operator=(abStack_138 + local_21c,&local_1f8);
          local_21c = local_21c + 1;
        }
        else {
          for (piVar15 = &pkVar11[lVar6].flags;
              (lVar10 = lVar12, lVar6 < lVar12 && (lVar10 = lVar6, (*piVar15 & 4) == 0));
              piVar15 = piVar15 + 6) {
            lVar6 = lVar6 + 1;
          }
          iVar5 = (int)lVar10;
        }
      }
      iVar5 = iVar5 + 1;
    }
  }
  else {
    bVar2 = false;
    snprintf(error.m_ptr,error.m_len,"not a dictionary");
  }
  lVar6 = 0x100;
  do {
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)((long)&local_178.m_tokens.
                             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + -0x40;
  } while (lVar6 != -0x40);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_1f8);
  return bVar2;
}

Assistant:

bool verify_message_impl(bdecode_node const& message, span<key_desc_t const> desc
	, span<bdecode_node> ret, span<char> error)
{
	TORRENT_ASSERT(desc.size() == ret.size());

	auto const size = ret.size();

	// get a non-root bdecode_node that still
	// points to the root. message should not be copied
	bdecode_node msg = message.non_owning();

	// clear the return buffer
	for (int i = 0; i < size; ++i)
		ret[i].clear();

	// when parsing child nodes, this is the stack
	// of bdecode_nodes to return to
	bdecode_node stack[5];
	int stack_ptr = -1;

	if (msg.type() != bdecode_node::dict_t)
	{
		std::snprintf(error.data(), static_cast<std::size_t>(error.size()), "not a dictionary");
		return false;
	}
	++stack_ptr;
	stack[stack_ptr] = msg;
	for (int i = 0; i < size; ++i)
	{
		key_desc_t const& k = desc[i];

		//		std::fprintf(stderr, "looking for %s in %s\n", k.name, print_entry(*msg).c_str());

		ret[i] = msg.dict_find(k.name);
		// none_t means any type
		if (ret[i] && ret[i].type() != k.type && k.type != bdecode_node::none_t)
			ret[i].clear();
		if (!ret[i] && (k.flags & key_desc_t::optional) == 0)
		{
			// the key was not found, and it's not an optional key
			std::snprintf(error.data(), static_cast<std::size_t>(error.size()), "missing '%s' key", k.name);
			return false;
		}

		if (k.size > 0
			&& ret[i]
			&& k.type == bdecode_node::string_t)
		{
			bool const invalid = (k.flags & key_desc_t::size_divisible)
				? (ret[i].string_length() % k.size) != 0
				: ret[i].string_length() != k.size;

			if (invalid)
			{
				// the string was not of the required size
				ret[i].clear();
				if ((k.flags & key_desc_t::optional) == 0)
				{
					std::snprintf(error.data(), static_cast<std::size_t>(error.size())
						, "invalid value for '%s'", k.name);
					return false;
				}
			}
		}
		if (k.flags & key_desc_t::parse_children)
		{
			TORRENT_ASSERT(k.type == bdecode_node::dict_t);

			if (ret[i])
			{
				++stack_ptr;
				TORRENT_ASSERT(stack_ptr < int(sizeof(stack) / sizeof(stack[0])));
				msg = ret[i];
				stack[stack_ptr] = msg;
			}
			else
			{
				// skip all children
				while (i < size && (desc[i].flags & key_desc_t::last_child) == 0) ++i;
				// if this assert is hit, desc is incorrect
				TORRENT_ASSERT(i < size);
			}
		}
		else if (k.flags & key_desc_t::last_child)
		{
			TORRENT_ASSERT(stack_ptr > 0);
			// this can happen if the specification passed
			// in is unbalanced. i.e. contain more last_child
			// nodes than parse_children
			if (stack_ptr == 0) return false;
			--stack_ptr;
			msg = stack[stack_ptr];
		}
	}
	return true;
}